

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O2

GraphId absl::lts_20250127::GetGraphId(Mutex *mu)

{
  GraphId GVar1;
  
  base_internal::SpinLock::Lock((SpinLock *)&deadlock_graph_mu);
  GVar1 = GetGraphIdLocked(mu);
  base_internal::SpinLock::Unlock((SpinLock *)&deadlock_graph_mu);
  return (GraphId)GVar1.handle;
}

Assistant:

ABSL_LOCKS_EXCLUDED(deadlock_graph_mu) {
  deadlock_graph_mu.Lock();
  GraphId id = GetGraphIdLocked(mu);
  deadlock_graph_mu.Unlock();
  return id;
}